

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

Node * node_new_group(Node *content)

{
  Node *node;
  Node *content_local;
  
  content_local = node_new();
  if (content_local == (Node *)0x0) {
    content_local = (Node *)0x0;
  }
  else {
    (content_local->u).base.node_type = ND_LIST;
    (content_local->u).base.body = content;
    (content_local->u).str.end = (OnigUChar *)0x0;
  }
  return content_local;
}

Assistant:

static Node*
node_new_group(Node* content)
{
  Node* node;

  node = node_new();
  CHECK_NULL_RETURN(node);
  ND_SET_TYPE(node, ND_LIST);
  ND_CAR(node) = content;
  ND_CDR(node) = NULL_NODE;

  return node;
}